

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

void __thiscall
tcb::unicode::detail::
unicode_view<__gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,___gnu_cxx::__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_char32_t,_char16_t>
::iterator::iterator
          (iterator *this,
          __normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
          first,__normal_iterator<const_char32_t_*,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
                last)

{
  code_point u;
  encoded_chars<char16_t> eVar1;
  
  (this->next_chars_).chars_ = (_Type)0x0;
  (this->next_chars_).size_ = 0;
  (this->first_)._M_current = first._M_current;
  (this->last_)._M_current = last._M_current;
  this->idx_ = '\0';
  if (first._M_current != last._M_current) {
    u = utf_traits<char32_t,4>::
        decode<__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>,__gnu_cxx::__normal_iterator<char32_t_const*,std::__cxx11::u32string>>
                  (&this->first_,last);
    eVar1 = utf_traits<char16_t,_2>::encode(u);
    this->next_chars_ = eVar1;
  }
  return;
}

Assistant:

constexpr encoded_chars(CharType _1)
            : chars_{{_1}}, size_{1} {}